

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * parse_do_statement(dmr_C *C,token *token,statement *stmt)

{
  token *ptVar1;
  statement *local_30;
  statement *iterator;
  expression *expr;
  statement *stmt_local;
  token *token_local;
  dmr_C *C_local;
  
  expr = (expression *)stmt;
  stmt_local = (statement *)token;
  token_local = (token *)C;
  start_iterator(C,stmt);
  stmt_local = (statement *)
               statement((dmr_C *)token_local,*(token **)&(stmt_local->pos).field_0x4,&local_30);
  if ((((uint)*(undefined8 *)stmt_local & 0x3f) == 2) &&
     ((token *)((anon_union_8_7_c7bfca54_for_token_2 *)&(stmt_local->field_2).field_1.expression)->
               number == token_local->next[0x169].next)) {
    stmt_local = *(statement **)&(stmt_local->pos).field_0x4;
  }
  else {
    dmrC_sparse_error((dmr_C *)token_local,*(position *)stmt_local,"expected \'while\' after \'do\'"
                     );
  }
  stmt_local = (statement *)
               dmrC_parens_expression
                         ((dmr_C *)token_local,(token *)stmt_local,(expression **)&iterator,
                          "after \'do-while\'");
  expr[1].pos = (position)iterator;
  (expr->field_5).field_14.ident_expression = (expression *)local_30;
  end_iterator((dmr_C *)token_local,(statement *)expr);
  if (((local_30 != (statement *)0x0) && (local_30->type != STMT_COMPOUND)) &&
     (token_local[0x27].field_2.special != 0)) {
    dmrC_warning((dmr_C *)token_local,local_30->pos,"do-while statement is not a compound statement"
                );
  }
  ptVar1 = dmrC_expect_token((dmr_C *)token_local,(token *)stmt_local,0x3b,"after statement");
  return ptVar1;
}

Assistant:

static struct token *parse_do_statement(struct dmr_C *C, struct token *token, struct statement *stmt)
{
	struct expression *expr;
	struct statement *iterator;

	start_iterator(C, stmt);
	token = statement(C, token->next, &iterator);
	if (dmrC_token_type(token) == TOKEN_IDENT && token->ident == C->S->while_ident)
		token = token->next;
	else
		dmrC_sparse_error(C, token->pos, "expected 'while' after 'do'");
	token = dmrC_parens_expression(C, token, &expr, "after 'do-while'");

	stmt->iterator_post_condition = expr;
	stmt->iterator_statement = iterator;
	end_iterator(C, stmt);

	if (iterator && iterator->type != STMT_COMPOUND && C->Wdo_while)
		dmrC_warning(C, iterator->pos, "do-while statement is not a compound statement");

	return dmrC_expect_token(C, token, ';', "after statement");
}